

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::iterate(UploadWaitDrawCase *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  int currentSampleNdx;
  int frameNdx;
  int betweenIterationDummyFrameCount;
  Functions *gl;
  UploadWaitDrawCase *this_local;
  
  pRVar5 = Context::getRenderContext
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  iVar1 = this->m_frameNdx;
  this->m_frameNdx = iVar1 + 1;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->m_iterationOrder,(long)this->m_sampleNdx);
  iVar2 = *pvVar6;
  busyWait(8000);
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
           ::operator[](&this->m_samples,(long)iVar2);
  if (iVar1 != pvVar7->numFrames) {
    drawMisc(this);
  }
  if (iVar1 == 0) {
    pvVar7 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ::operator[](&this->m_samples,(long)iVar2);
    pvVar8 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ::operator[](&this->m_results,(long)iVar2);
    uploadBuffer(this,pvVar7,pvVar8);
  }
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
           ::operator[](&this->m_samples,(long)iVar2);
  if (iVar1 == pvVar7->numFrames) {
    pvVar7 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ::operator[](&this->m_samples,(long)iVar2);
    pvVar8 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ::operator[](&this->m_results,(long)iVar2);
    drawFromBuffer(this,pvVar7,pvVar8);
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      reuseAndDeleteBuffer(this);
    }
  }
  else {
    pvVar7 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ::operator[](&this->m_samples,(long)iVar2);
    if (iVar1 == pvVar7->numFrames + 5) {
      this->m_sampleNdx = this->m_sampleNdx + 1;
      this->m_frameNdx = 0;
    }
  }
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"post-iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1631);
  iVar1 = this->m_sampleNdx;
  sVar9 = std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
          ::size(&this->m_samples);
  bVar3 = (int)sVar9 <= iVar1;
  if (bVar3) {
    logAndSetTestResult(this);
  }
  this_local._4_4_ = (IterateResult)!bVar3;
  return this_local._4_4_;
}

Assistant:

UploadWaitDrawCase::IterateResult UploadWaitDrawCase::iterate (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const int				betweenIterationDummyFrameCount = 5; // draw misc between test samples
	const int				frameNdx						= m_frameNdx++;
	const int				currentSampleNdx				= m_iterationOrder[m_sampleNdx];

	// Simulate work for about 8ms
	busyWait(8000);

	// Dummy rendering during dummy frames
	if (frameNdx != m_samples[currentSampleNdx].numFrames)
	{
		// draw similar from another buffer
		drawMisc();
	}

	if (frameNdx == 0)
	{
		// upload and start the clock
		uploadBuffer(m_samples[currentSampleNdx], m_results[currentSampleNdx]);
	}

	if (frameNdx == m_samples[currentSampleNdx].numFrames) // \note: not else if, m_samples[currentSampleNdx].numFrames can be 0
	{
		// draw using the uploaded buffer
		drawFromBuffer(m_samples[currentSampleNdx], m_results[currentSampleNdx]);

		// re-use buffer for something else to make sure test iteration do not affect each other
		if (m_bufferState == BUFFERSTATE_NEW)
			reuseAndDeleteBuffer();
	}
	else if (frameNdx == m_samples[currentSampleNdx].numFrames + betweenIterationDummyFrameCount)
	{
		// next sample
		++m_sampleNdx;
		m_frameNdx = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "post-iterate");

	if (m_sampleNdx < (int)m_samples.size())
		return CONTINUE;

	logAndSetTestResult();
	return STOP;
}